

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
write_int<long_long,fmt::v6::basic_format_specs<wchar_t>>
          (basic_writer<fmt::v6::buffer_range<wchar_t>> *this,longlong value,
          basic_format_specs<wchar_t> *spec)

{
  byte bVar1;
  byte bVar2;
  int_writer<long_long,_fmt::v6::basic_format_specs<wchar_t>_> local_20;
  
  bVar1 = spec->type;
  local_20.prefix_size = 0;
  if (value < 0) {
    local_20.prefix[0] = '-';
    local_20.prefix_size = 1;
    local_20.abs_value = -value;
  }
  else {
    bVar2 = (byte)spec->field_0x9 >> 4 & 7;
    local_20.abs_value = value;
    if (1 < bVar2) {
      local_20.prefix[0] = ' ';
      if (bVar2 == 2) {
        local_20.prefix[0] = '+';
      }
      local_20.prefix_size = 1;
    }
  }
  local_20.writer = (basic_writer<fmt::v6::buffer_range<wchar_t>_> *)this;
  local_20.specs = spec;
  if (bVar1 < 0x62) {
    if (bVar1 < 0x4c) {
      if (bVar1 == 0) {
LAB_0015655b:
        basic_writer<fmt::v6::buffer_range<wchar_t>_>::
        int_writer<long_long,_fmt::v6::basic_format_specs<wchar_t>_>::on_dec(&local_20);
        return;
      }
      if (bVar1 == 0x42) goto LAB_00156573;
    }
    else {
      if (bVar1 == 0x4c) goto LAB_00156567;
      if (bVar1 == 0x58) goto LAB_00156545;
    }
  }
  else if (bVar1 < 0x6e) {
    if (bVar1 == 0x62) {
LAB_00156573:
      basic_writer<fmt::v6::buffer_range<wchar_t>_>::
      int_writer<long_long,_fmt::v6::basic_format_specs<wchar_t>_>::on_bin(&local_20);
      return;
    }
    if (bVar1 == 100) goto LAB_0015655b;
  }
  else {
    if (bVar1 == 0x6e) {
LAB_00156567:
      basic_writer<fmt::v6::buffer_range<wchar_t>_>::
      int_writer<long_long,_fmt::v6::basic_format_specs<wchar_t>_>::on_num(&local_20);
      return;
    }
    if (bVar1 == 0x6f) {
      basic_writer<fmt::v6::buffer_range<wchar_t>_>::
      int_writer<long_long,_fmt::v6::basic_format_specs<wchar_t>_>::on_oct(&local_20);
      return;
    }
    if (bVar1 == 0x78) {
LAB_00156545:
      basic_writer<fmt::v6::buffer_range<wchar_t>_>::
      int_writer<long_long,_fmt::v6::basic_format_specs<wchar_t>_>::on_hex(&local_20);
      return;
    }
  }
  basic_writer<fmt::v6::buffer_range<wchar_t>_>::
  int_writer<long_long,_fmt::v6::basic_format_specs<wchar_t>_>::on_error(&local_20);
}

Assistant:

void write_int(T value, const Spec& spec) {
    handle_int_type_spec(spec.type, int_writer<T, Spec>(*this, value, spec));
  }